

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

Ref __thiscall gnilk::LogManager::GetExistingLog(LogManager *this,string *name)

{
  bool bVar1;
  __shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  mutex_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref RVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_true>
  local_48 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_true>
  local_30;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  string *name_local;
  LogManager *this_local;
  
  lock._M_device = in_RDX;
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)(name + 2));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
               *)&name[4].field_2,(key_type *)lock._M_device);
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
              *)&name[4].field_2);
  bVar1 = std::__detail::operator==(&local_30,local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::shared_ptr<gnilk::Log>::shared_ptr((shared_ptr<gnilk::Log> *)this,(nullptr_t)0x0);
  }
  else {
    this_00 = (__shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
                            *)&name[4].field_2,(key_type *)lock._M_device);
    std::__shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(this_00);
    LogInstance::GetLog((LogInstance *)this);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  RVar2.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar2.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ref)RVar2.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Log::Ref LogManager::GetExistingLog(const std::string &name) {
    std::lock_guard<std::mutex> lock(instLock);
    if (logInstances.find(name) != logInstances.end()) {
        return logInstances[name]->GetLog();
    }
    return nullptr;
}